

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_tests.cpp
# Opt level: O0

void __thiscall ConvolutionTest::run_real_convolve(ConvolutionTest *this,Context *ctx)

{
  anon_enum_32 aVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer pFVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *pPVar5;
  size_t sVar6;
  Scalar *filter_00;
  BlockConvolver *pBVar7;
  pointer pBVar8;
  reference pvVar9;
  reference pvVar10;
  ScalarWithConstIfNotLvalue *pSVar11;
  ScalarWithConstIfNotLvalue *out;
  bool local_289;
  int local_27c;
  type local_200;
  type local_1c8;
  type local_190;
  Scalar local_154;
  type local_150;
  ArrayWrapper<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_> local_118;
  CmpEQReturnType local_e0;
  int local_90;
  value_type local_8c;
  int last_filter;
  int this_filter;
  ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> block_sel;
  size_t offset;
  size_t block;
  unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  convolver;
  undefined1 local_48 [8];
  Filter filter;
  size_t i;
  vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  filters;
  Context *ctx_local;
  ConvolutionTest *this_local;
  
  filters.
  super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ctx;
  std::vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ::vector((vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
            *)&i);
  for (filter.impl.
       super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var2._M_pi = filter.impl.
                    super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi,
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
               ::size(&this->irs),
      pFVar3 = filters.
               super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage, _Var2._M_pi < p_Var4;
      filter.impl.
      super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(filter.impl.
                    super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
    pPVar5 = &std::
              vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&this->irs,
                           (size_type)
                           filter.impl.
                           super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->
              super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>;
    sVar6 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::rows(pPVar5);
    pPVar5 = &std::
              vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](&this->irs,
                           (size_type)
                           filter.impl.
                           super___shared_ptr<ear::dsp::block_convolver_impl::Filter,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->
              super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>;
    filter_00 = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data(pPVar5);
    ear::dsp::block_convolver::Filter::Filter((Filter *)local_48,(Context *)pFVar3,sVar6,filter_00);
    sVar6 = ear::dsp::block_convolver::Filter::num_blocks((Filter *)local_48);
    if (this->max_num_blocks < sVar6) {
      sVar6 = ear::dsp::block_convolver::Filter::num_blocks((Filter *)local_48);
      this->max_num_blocks = sVar6;
    }
    std::
    vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>::
    push_back((vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
               *)&i,(value_type *)local_48);
    ear::dsp::block_convolver::Filter::~Filter((Filter *)local_48);
  }
  std::
  unique_ptr<ear::dsp::block_convolver::BlockConvolver,std::default_delete<ear::dsp::block_convolver::BlockConvolver>>
  ::unique_ptr<std::default_delete<ear::dsp::block_convolver::BlockConvolver>,void>
            ((unique_ptr<ear::dsp::block_convolver::BlockConvolver,std::default_delete<ear::dsp::block_convolver::BlockConvolver>>
              *)&block);
  aVar1 = this->constructor;
  if (aVar1 == NO_FILTER) {
    pBVar7 = (BlockConvolver *)operator_new(8);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver
              (pBVar7,(Context *)
                      filters.
                      super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,this->max_num_blocks);
    std::
    unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
    ::reset((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
             *)&block,pBVar7);
  }
  else if (aVar1 == WITH_FILTER_NUM_BLOCKS) {
    pBVar7 = (BlockConvolver *)operator_new(8);
    pFVar3 = filters.
             super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar9 = std::
             vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
             ::operator[]((vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
                           *)&i,(long)this->initial_ir);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver
              (pBVar7,(Context *)pFVar3,pvVar9,this->max_num_blocks);
    std::
    unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
    ::reset((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
             *)&block,pBVar7);
  }
  else if (aVar1 == WITH_FILTER_NO_NUM_BLOCKS) {
    pBVar7 = (BlockConvolver *)operator_new(8);
    pFVar3 = filters.
             super__Vector_base<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar9 = std::
             vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
             ::operator[]((vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
                           *)&i,(long)this->initial_ir);
    ear::dsp::block_convolver::BlockConvolver::BlockConvolver(pBVar7,(Context *)pFVar3,pvVar9,0);
    std::
    unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
    ::reset((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
             *)&block,pBVar7);
  }
  Eigen::internal::set_is_malloc_allowed(false);
  if (-1 < this->initial_ir) {
    pBVar8 = std::
             unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
             ::operator->((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                           *)&block);
    pvVar9 = std::
             vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
             ::operator[]((vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
                           *)&i,(long)this->initial_ir);
    ear::dsp::block_convolver::BlockConvolver::set_filter(pBVar8,pvVar9);
  }
  for (offset = 0; offset < this->num_blocks; offset = offset + 1) {
    block_sel._16_8_ = this->block_size * offset;
    Eigen::seqN<unsigned_long,unsigned_long>
              ((ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> *)&last_filter,
               (Eigen *)block_sel._16_8_,this->block_size,block_sel._16_8_);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&this->ir_for_block,offset);
    local_8c = *pvVar10;
    if (offset == 0) {
      local_27c = this->initial_ir;
    }
    else {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&this->ir_for_block,offset - 1);
      local_27c = *pvVar10;
    }
    local_90 = local_27c;
    if (local_27c != local_8c) {
      if (local_8c < 0) {
        pBVar8 = std::
                 unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                 ::operator->((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                               *)&block);
        ear::dsp::block_convolver::BlockConvolver::fade_down(pBVar8);
      }
      else {
        pBVar8 = std::
                 unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                 ::operator->((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                               *)&block);
        pvVar9 = std::
                 vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
                 ::operator[]((vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
                               *)&i,(long)local_8c);
        ear::dsp::block_convolver::BlockConvolver::crossfade_filter(pBVar8,pvVar9);
      }
    }
    local_289 = false;
    if ((this->null_for_zeros & 1U) != 0) {
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()
                (&local_150,(DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->input,
                 (ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> *)&last_filter);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::array
                (&local_118,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
                 &local_150);
      local_154 = 0.0;
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>_>
      ::operator==(&local_e0,
                   (ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>_>
                    *)&local_118,&local_154);
      local_289 = Eigen::
                  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)0>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Array<float,_-1,_1,_0,_-1,_1>_>_>_>
                  ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<float,_float,_(Eigen::internal::ComparisonName)0>,_const_Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Array<float,__1,_1,_0,__1,_1>_>_>_>
                         *)&local_e0);
    }
    if (local_289 == false) {
      pBVar8 = std::
               unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
               ::operator->((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                             *)&block);
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()
                (&local_1c8,(DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->input,
                 (ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> *)&last_filter);
      pSVar11 = Eigen::MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                ::data((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                        *)&local_1c8);
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()
                (&local_200,(DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->real_output,
                 (ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> *)&last_filter);
      out = Eigen::MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
            data((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                 &local_200);
      ear::dsp::block_convolver::BlockConvolver::process(pBVar8,pSVar11,out);
    }
    else {
      pBVar8 = std::
               unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
               ::operator->((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                             *)&block);
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::operator()
                (&local_190,(DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&this->real_output,
                 (ArithmeticSequence<long,_long,_Eigen::internal::FixedInt<1>_> *)&last_filter);
      pSVar11 = Eigen::MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>
                ::data((MapBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                        *)&local_190);
      ear::dsp::block_convolver::BlockConvolver::process(pBVar8,(float *)0x0,pSVar11);
    }
  }
  Eigen::internal::set_is_malloc_allowed(true);
  std::
  unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
  ::~unique_ptr((unique_ptr<ear::dsp::block_convolver::BlockConvolver,_std::default_delete<ear::dsp::block_convolver::BlockConvolver>_>
                 *)&block);
  std::vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
  ::~vector((vector<ear::dsp::block_convolver::Filter,_std::allocator<ear::dsp::block_convolver::Filter>_>
             *)&i);
  return;
}

Assistant:

void run_real_convolve(const Context &ctx) {
    // Create filters from irs, while finding the required number of blocks.
    std::vector<Filter> filters;
    for (size_t i = 0; i < irs.size(); i++) {
      Filter filter(ctx, irs[i].rows(), irs[i].data());
      if (filter.num_blocks() > max_num_blocks)
        max_num_blocks = filter.num_blocks();
      filters.push_back(std::move(filter));
    }

    std::unique_ptr<BlockConvolver> convolver;

    // Create the filter
    switch (constructor) {
      case NO_FILTER:
        convolver.reset(new BlockConvolver(ctx, max_num_blocks));
        break;
      case WITH_FILTER_NUM_BLOCKS:
        convolver.reset(
            new BlockConvolver(ctx, filters[initial_ir], max_num_blocks));
        break;
      case WITH_FILTER_NO_NUM_BLOCKS:
        convolver.reset(new BlockConvolver(ctx, filters[initial_ir]));
        break;
    }

    Eigen::internal::set_is_malloc_allowed(false);

    // don't set the starting filter if initial_ir is invalid
    if (initial_ir >= 0) {
      convolver->set_filter(filters[initial_ir]);
    }

    // filter each block
    for (size_t block = 0; block < num_blocks; block++) {
      const size_t offset = block_size * block;
      auto block_sel = Eigen::seqN(offset, block_size);

      // crossfade if the filter has changed
      int this_filter = ir_for_block[block];
      int last_filter = block == 0 ? initial_ir : ir_for_block[block - 1];
      if (last_filter != this_filter) {
        if (this_filter >= 0)
          convolver->crossfade_filter(filters[this_filter]);
        else
          convolver->fade_down();
      }

      // filter the block to the output; possibly passing null if zeros are
      // detected
      if (null_for_zeros && (input(block_sel).array() == 0.0).all()) {
        convolver->process(nullptr, real_output(block_sel).data());
      } else {
        convolver->process(input(block_sel).data(),
                           real_output(block_sel).data());
      }
    }
    Eigen::internal::set_is_malloc_allowed(true);
  }